

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

bool ON_MakeKnotVectorPeriodic(int order,int cv_count,double *knot)

{
  double *pdVar1;
  int local_34;
  double *pdStack_30;
  int i;
  double *k1;
  double *k0;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  if (((order < 2) || (cv_count < order)) || (knot == (double *)0x0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
               ,0x362,"","ON_MakePeriodicKnotVector(): illegal input");
    cv_count_local._3_1_ = false;
  }
  else if (order == 2) {
    if (cv_count < 4) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                 ,0x369,"","ON_MakePeriodicKnotVector(): illegal input degree=1, cv_count<4");
      cv_count_local._3_1_ = false;
    }
    else {
      cv_count_local._3_1_ = true;
    }
  }
  else {
    if (order == 3) {
      if (cv_count < 4) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                   ,0x372,"","ON_MakePeriodicKnotVector(): illegal input degree=2, cv_count<5");
        return false;
      }
    }
    else if (cv_count < order * 2 + -2) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                 ,0x378,"","ON_MakePeriodicKnotVector(): illegal input degree>=3, cv_count<2*degree"
                );
      return false;
    }
    k1 = knot + (long)order + -2;
    pdStack_30 = knot + (long)cv_count + -1;
    local_34 = order + -2;
    while (local_34 != 0) {
      pdStack_30[1] = (k1[1] - *k1) + *pdStack_30;
      k1 = k1 + 1;
      pdStack_30 = pdStack_30 + 1;
      local_34 = local_34 + -1;
    }
    k1 = knot + (long)order + -2;
    local_34 = order + -2;
    pdVar1 = knot + cv_count;
    while( true ) {
      pdStack_30 = pdVar1 + -1;
      if (local_34 == 0) break;
      k1[-1] = (pdVar1[-2] - *pdStack_30) + *k1;
      k1 = k1 + -1;
      local_34 = local_34 + -1;
      pdVar1 = pdStack_30;
    }
    cv_count_local._3_1_ = true;
  }
  return cv_count_local._3_1_;
}

Assistant:

bool ON_MakeKnotVectorPeriodic(
          int order,          // order (>=2)
          int cv_count,       // cv count (>= (order>=4) ? 2*(order-1) : 5)
          double* knot        // knot[] array
          )
{
  double *k0, *k1;
  int i;
  
  if ( order < 2 || cv_count < order || !knot ) {
    ON_ERROR("ON_MakePeriodicKnotVector(): illegal input");
    return false;
  }

  switch(order) {
  case 2:
    if ( cv_count < 4 ) {
      ON_ERROR("ON_MakePeriodicKnotVector(): illegal input degree=1, cv_count<4");
      return false;
    }
    else {
      return true;
    }
    break;
  case 3:
    if ( cv_count < 4 ) {
      ON_ERROR("ON_MakePeriodicKnotVector(): illegal input degree=2, cv_count<5");
      return false;
    }
    break;
  default:
    if ( cv_count < 2*order-2 ) {
      ON_ERROR("ON_MakePeriodicKnotVector(): illegal input degree>=3, cv_count<2*degree");
      return false;
    }
    break;
  }

  k0 = knot + order-2;
  k1 = knot + cv_count-1;
  i = order-2;
  while (i--) {
    k1[1] = k0[1]-k0[0]+k1[0];
    k0++; k1++;
  }
  k0 = knot + order-2;
  k1 = knot + cv_count-1;
  i = order-2;
  while (i--) {
    k0[-1] = k1[-1] - k1[0] + k0[0];
    k0--; 
    k1--;
  }
  return true;
}